

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaptureTheFlag.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_339b0::CtfSeeker::update(CtfSeeker *this,float currentTime,float elapsedTime)

{
  SimpleVehicle *in_RDI;
  Vec3 VVar1;
  Vec3 steer;
  float in_stack_00000124;
  Vec3 *in_stack_00000128;
  SimpleVehicle *in_stack_00000130;
  CtfSeeker *in_stack_00000210;
  float in_stack_ffffffffffffff78;
  float in_stack_ffffffffffffff7c;
  undefined8 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  float in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  float in_stack_ffffffffffffffbc;
  float in_stack_ffffffffffffffc0;
  float in_stack_ffffffffffffffc4;
  Vec3 local_38;
  Vec3 local_28;
  Vec3 local_1c [2];
  
  updateState((CtfSeeker *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
              (float)((ulong)in_stack_ffffffffffffff88 >> 0x20));
  OpenSteer::Vec3::Vec3(local_1c,0.0,0.0,0.0);
  if (in_RDI[1].super_SimpleVehicle_3.
      super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
      super_LocalSpaceMixin<OpenSteer::AbstractVehicle>._side.z == 0.0) {
    VVar1 = steeringForSeeker(in_stack_00000210);
    local_38.z = VVar1.z;
    local_28.z = local_38.z;
    local_38._0_8_ = VVar1._0_8_;
    local_28.x = local_38.x;
    local_28.y = local_38.y;
    VVar1 = OpenSteer::Vec3::operator=(local_1c,&local_28);
    in_stack_ffffffffffffffb0 = VVar1.z;
    in_stack_ffffffffffffffbc = VVar1.x;
    in_stack_ffffffffffffffc0 = VVar1.y;
    in_stack_ffffffffffffffc4 = in_stack_ffffffffffffffb0;
  }
  else {
    OpenSteer::SimpleVehicle::applyBrakingForce
              (in_RDI,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
  }
  OpenSteer::SimpleVehicle::applySteeringForce
            (in_stack_00000130,in_stack_00000128,in_stack_00000124);
  OpenSteer::SimpleVehicle::annotationVelocityAcceleration((SimpleVehicle *)0x12d6b3);
  (*(in_RDI->super_SimpleVehicle_3).
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[8])();
  OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
  recordTrailVertex((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)
                    CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                    in_stack_ffffffffffffffbc,
                    (Vec3 *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  return;
}

Assistant:

void CtfSeeker::update (const float currentTime, const float elapsedTime)
    {
        // do behavioral state transitions, as needed
        updateState (currentTime);

        // determine and apply steering/braking forces
        Vec3 steer (0, 0, 0);
        if (state == running)
        {
            steer = steeringForSeeker ();
        }
        else
        {
            applyBrakingForce (gBrakingRate, elapsedTime);
        }
        applySteeringForce (steer, elapsedTime);

        // annotation
        annotationVelocityAcceleration ();
        recordTrailVertex (currentTime, position());
    }